

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linit.c
# Opt level: O2

void luaL_openselectedlibs(lua_State *L,int load,int preload)

{
  char *k;
  uint uVar1;
  lua_CFunction *pp_Var2;
  
  luaL_getsubtable(L,-0xf4628,"_PRELOAD");
  uVar1 = 1;
  for (pp_Var2 = &stdlibs[0].func; k = ((luaL_Reg *)(pp_Var2 + -1))->name, k != (char *)0x0;
      pp_Var2 = pp_Var2 + 2) {
    if ((uVar1 & load) == 0) {
      if ((preload & uVar1) != 0) {
        lua_pushcclosure(L,*pp_Var2,0);
        lua_setfield(L,-2,k);
      }
    }
    else {
      luaL_requiref(L,k,*pp_Var2,1);
      lua_settop(L,-2);
    }
    uVar1 = uVar1 * 2;
  }
  lua_settop(L,-2);
  return;
}

Assistant:

LUALIB_API void luaL_openselectedlibs (lua_State *L, int load, int preload) {
  int mask;
  const luaL_Reg *lib;
  luaL_getsubtable(L, LUA_REGISTRYINDEX, LUA_PRELOAD_TABLE);
  for (lib = stdlibs, mask = 1; lib->name != NULL; lib++, mask <<= 1) {
    if (load & mask) {  /* selected? */
      luaL_requiref(L, lib->name, lib->func, 1);  /* require library */
      lua_pop(L, 1);  /* remove result from the stack */
    }
    else if (preload & mask) {  /* selected? */
      lua_pushcfunction(L, lib->func);
      lua_setfield(L, -2, lib->name);  /* add library to PRELOAD table */
    }
  }
  lua_assert((mask >> 1) == LUA_UTF8LIBK);
  lua_pop(L, 1);  /* remove PRELOAD table */
}